

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpattern.cc
# Opt level: O1

PatternBlock * __thiscall PatternBlock::intersect(PatternBlock *this,PatternBlock *b)

{
  iterator iVar1;
  int iVar2;
  uintm uVar3;
  uintm uVar4;
  uintm uVar5;
  uintm uVar6;
  PatternBlock *pPVar7;
  int iVar8;
  uintm resval;
  uintm resmask;
  int local_68;
  uint local_64;
  PatternBlock *local_60;
  uint local_54;
  PatternBlock *local_50;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_48;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_40;
  PatternBlock *local_38;
  
  local_50 = this;
  if ((this->nonzerosize == -1) || (b->nonzerosize == -1)) {
    pPVar7 = (PatternBlock *)operator_new(0x38);
    PatternBlock(pPVar7,false);
  }
  else {
    pPVar7 = (PatternBlock *)operator_new(0x38);
    local_60 = pPVar7;
    PatternBlock(pPVar7,true);
    iVar2 = local_50->nonzerosize + local_50->offset;
    local_68 = b->nonzerosize + b->offset;
    if (local_68 < iVar2) {
      local_68 = iVar2;
    }
    pPVar7->offset = 0;
    if (0 < local_68) {
      local_40 = (vector<unsigned_int,std::allocator<unsigned_int>> *)&pPVar7->maskvec;
      local_48 = (vector<unsigned_int,std::allocator<unsigned_int>> *)&pPVar7->valvec;
      iVar2 = 0;
      iVar8 = 0;
      local_38 = b;
      do {
        pPVar7 = local_50;
        uVar3 = getMask(local_50,iVar2,0x20);
        uVar4 = getValue(pPVar7,iVar2,0x20);
        pPVar7 = local_38;
        uVar5 = getMask(local_38,iVar2,0x20);
        uVar6 = getValue(pPVar7,iVar2,0x20);
        pPVar7 = local_60;
        if (((uVar6 ^ uVar4) & uVar3 & uVar5) != 0) {
          local_68 = -1;
          break;
        }
        local_54 = uVar5 | uVar3;
        local_64 = uVar4 & uVar3 | uVar6 & uVar5;
        iVar1._M_current =
             (local_60->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (local_60->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>(local_40,iVar1,&local_54);
        }
        else {
          *iVar1._M_current = local_54;
          (local_60->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        iVar1._M_current =
             (pPVar7->valvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (pPVar7->valvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>(local_48,iVar1,&local_64);
        }
        else {
          *iVar1._M_current = local_64;
          (pPVar7->valvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        iVar8 = iVar8 + 4;
        iVar2 = iVar2 + 0x20;
      } while (iVar8 < local_68);
    }
    pPVar7->nonzerosize = local_68;
    normalize(pPVar7);
  }
  return pPVar7;
}

Assistant:

PatternBlock *PatternBlock::intersect(const PatternBlock *b) const

{ // Construct the intersecting pattern
  if (alwaysFalse() || b->alwaysFalse())
    return new PatternBlock(false);
  PatternBlock *res = new PatternBlock(true);
  int4 maxlength = (getLength() > b->getLength()) ? getLength() : b->getLength();

  res->offset = 0;
  int4 offset = 0;
  uintm mask1,val1,mask2,val2,commonmask;
  uintm resmask,resval;
  while(offset < maxlength) {
    mask1 = getMask(offset*8,sizeof(uintm)*8);
    val1 = getValue(offset*8,sizeof(uintm)*8);
    mask2 = b->getMask(offset*8,sizeof(uintm)*8);
    val2 = b->getValue(offset*8,sizeof(uintm)*8);
    commonmask = mask1 & mask2;	// Bits in mask shared by both patterns
    if ((commonmask & val1) != (commonmask & val2)) {
      res->nonzerosize = -1;	// Impossible pattern
      res->normalize();
      return res;
    }
    resmask = mask1 | mask2;
    resval = (mask1 & val1) | (mask2 & val2);
    res->maskvec.push_back(resmask);
    res->valvec.push_back(resval);
    offset += sizeof(uintm);
  }
  res->nonzerosize = maxlength;
  res->normalize();
  return res;
}